

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::
Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
InnerMap::InnerMap(InnerMap *this,ulong n,Arena *param_3)

{
  size_type sVar1;
  void **ppvVar2;
  
  this->num_elements_ = 0;
  sVar1 = Seed(this);
  this->seed_ = sVar1;
  this->table_ = (void **)0x0;
  (this->alloc_).arena_ = param_3;
  sVar1 = 8;
  if (8 < n) {
    sVar1 = n;
  }
  ppvVar2 = CreateEmptyTable(this,sVar1);
  this->table_ = ppvVar2;
  this->index_of_first_non_null_ = sVar1;
  this->num_buckets_ = sVar1;
  return;
}

Assistant:

InnerMap(size_type n, hasher h, Allocator alloc)
        : hasher(h),
          num_elements_(0),
          seed_(Seed()),
          table_(NULL),
          alloc_(alloc) {
      n = TableSize(n);
      table_ = CreateEmptyTable(n);
      num_buckets_ = index_of_first_non_null_ = n;
    }